

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O2

void __thiscall ReportWriter::writeLinkHeader(ReportWriter *this)

{
  ofstream *poVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  size_type *local_58;
  string s1;
  
  poVar1 = this->sout;
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  local_58 = &s1._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_58,'H');
  poVar4 = std::operator<<((ostream *)this->sout,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)this->sout;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x1a;
  std::operator<<(poVar4," ");
  poVar4 = std::operator<<((ostream *)this->sout,
                           "   Flow Rate     Leakage    Velocity   Head Loss      Status");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = (ostream *)this->sout;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x1a;
  std::operator<<(poVar4,"  Link");
  poVar4 = (ostream *)this->sout;
  lVar2 = *(long *)poVar4;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 0xc;
  std::__cxx11::string::string
            ((string *)(s1.field_2._M_local_buf + 8),(string *)((this->network->units).names + 5));
  std::operator<<(poVar4,(string *)(s1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
  poVar4 = (ostream *)this->sout;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xc;
  std::__cxx11::string::string
            ((string *)(s1.field_2._M_local_buf + 8),(string *)((this->network->units).names + 5));
  std::operator<<(poVar4,(string *)(s1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
  poVar4 = (ostream *)this->sout;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xc;
  std::__cxx11::string::string
            ((string *)(s1.field_2._M_local_buf + 8),(string *)((this->network->units).names + 6));
  std::operator<<(poVar4,(string *)(s1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
  poVar4 = (ostream *)this->sout;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0xc;
  std::__cxx11::string::string
            ((string *)(s1.field_2._M_local_buf + 8),(string *)((this->network->units).names + 7));
  poVar4 = std::operator<<(poVar4,(string *)(s1.field_2._M_local_buf + 8));
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
  poVar4 = (ostream *)this->sout;
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ReportWriter::writeLinkHeader()
{
    sout << left;
    string s1(72, '-');
    sout << "  " << s1 << endl;
    sout << setw(26) << " ";
    sout << "   Flow Rate     Leakage    Velocity   Head Loss      Status" << endl;

    sout << setw(26) << "  Link";
    sout << right;
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::VELOCITY);
    sout << setw(12) << network->getUnits(Units::HEADLOSS) << endl;

    sout << left;
    sout << "  " << s1 << endl;
}